

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

void XFreeUtf8FontStruct(Display *dpy,XUtf8FontStruct *font_set)

{
  long lVar1;
  
  if (0 < font_set->nb_font) {
    lVar1 = 0;
    do {
      if (font_set->fonts[lVar1] != (XFontStruct *)0x0) {
        XFreeFont(dpy);
        free(font_set->font_name_list[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < font_set->nb_font);
  }
  free(font_set->ranges);
  free(font_set->font_name_list);
  free(font_set->fonts);
  free(font_set->encodings);
  free(font_set);
  return;
}

Assistant:

void
XFreeUtf8FontStruct(Display 	    *dpy,
		    XUtf8FontStruct *font_set) {

  int i;
  i = 0;
  while (i < font_set->nb_font) {
    if (font_set->fonts[i]) {
	XFreeFont(dpy, font_set->fonts[i]);
	free(font_set->font_name_list[i]);
    }
    i++;
  }
  free(font_set->ranges);
  free(font_set->font_name_list);
  free(font_set->fonts);
  free(font_set->encodings);
  free(font_set);
}